

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_parser.cpp
# Opt level: O0

CheckedError __thiscall
flatbuffers::Parser::TryTypedValue
          (Parser *this,string *name,int dtoken,bool check,Value *e,BaseType req,bool *destmatch)

{
  ulong uVar1;
  char *pcVar2;
  long lVar3;
  undefined7 in_register_00000009;
  undefined4 in_register_00000014;
  undefined4 in_register_0000008c;
  bool bVar4;
  byte *in_stack_00000010;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a0;
  long local_180;
  size_type k;
  string *s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  allocator<char> local_131;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_110;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_f0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_d0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  BaseType *local_30;
  Value *e_local;
  bool check_local;
  string *psStack_20;
  int dtoken_local;
  string *name_local;
  Parser *this_local;
  CheckedError *ce;
  
  psStack_20 = (string *)CONCAT44(in_register_00000014,dtoken);
  e_local._4_4_ = (int)CONCAT71(in_register_00000009,check);
  e_local._3_1_ = (byte)e & 1;
  local_30 = (BaseType *)CONCAT44(in_register_0000008c,req);
  bVar4 = false;
  if ((*in_stack_00000010 & 1) == 0) {
    bVar4 = e_local._4_4_ == *(int *)((long)&name->field_2 + 0xc);
  }
  name_local = name;
  this_local = this;
  if (!bVar4) {
    __assert_fail("*destmatch == false && dtoken == token_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/aardappel[P]flatbuffers/src/idl_parser.cpp"
                  ,0x815,
                  "CheckedError flatbuffers::Parser::TryTypedValue(const std::string *, int, bool, Value &, BaseType, bool *)"
                 );
  }
  *in_stack_00000010 = 1;
  std::__cxx11::string::operator=((string *)(local_30 + 8),(string *)&name[1]._M_string_length);
  if ((e_local._3_1_ & 1) == 0) {
    if (*local_30 != BASE_TYPE_NONE) {
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_130,"type mismatch: expecting: ",&local_131);
      pcVar2 = TypeName(*local_30);
      std::operator+(&local_110,&local_130,pcVar2);
      std::operator+(&local_f0,&local_110,", found: ");
      pcVar2 = TypeName((BaseType)destmatch);
      std::operator+(&local_d0,&local_f0,pcVar2);
      std::operator+(&local_b0,&local_d0,", name: ");
      s._6_1_ = 0;
      if (psStack_20 == (string *)0x0) {
        std::allocator<char>::allocator();
        s._6_1_ = 1;
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_168,"",(allocator<char> *)((long)&s + 7));
      }
      else {
        std::__cxx11::string::string((string *)&local_168,psStack_20);
      }
      std::operator+(&local_90,&local_b0,&local_168);
      std::operator+(&local_70,&local_90,", value: ");
      std::operator+(&local_50,&local_70,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     (local_30 + 8));
      Error(this,name);
      std::__cxx11::string::~string((string *)&local_50);
      std::__cxx11::string::~string((string *)&local_70);
      std::__cxx11::string::~string((string *)&local_90);
      std::__cxx11::string::~string((string *)&local_168);
      if ((s._6_1_ & 1) != 0) {
        std::allocator<char>::~allocator((allocator<char> *)((long)&s + 7));
      }
      std::__cxx11::string::~string((string *)&local_b0);
      std::__cxx11::string::~string((string *)&local_d0);
      std::__cxx11::string::~string((string *)&local_f0);
      std::__cxx11::string::~string((string *)&local_110);
      std::__cxx11::string::~string((string *)&local_130);
      std::allocator<char>::~allocator(&local_131);
      goto LAB_00121048;
    }
    *local_30 = (BaseType)destmatch;
  }
  if ((e_local._4_4_ != 0x103) && (bVar4 = IsFloat(*local_30), bVar4)) {
    k = (size_type)(local_30 + 8);
    local_180 = std::__cxx11::string::find_first_of((char *)k,0x1b6c6a);
    if ((local_180 != -1) &&
       ((uVar1 = std::__cxx11::string::length(), local_180 + 1U < uVar1 &&
        (pcVar2 = (char *)std::__cxx11::string::operator[](k), *pcVar2 == '0')))) {
      pcVar2 = (char *)std::__cxx11::string::operator[](k);
      bVar4 = is_alpha_char(*pcVar2,'X');
      if ((bVar4) && (lVar3 = std::__cxx11::string::find_first_of((char *)k,0x1b5d92), lVar3 == -1))
      {
        std::operator+(&local_1c0,
                       "invalid number, the exponent suffix of hexadecimal floating-point literals is mandatory: \""
                       ,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)k);
        std::operator+(&local_1a0,&local_1c0,"\"");
        Error(this,name);
        std::__cxx11::string::~string((string *)&local_1a0);
        std::__cxx11::string::~string((string *)&local_1c0);
        goto LAB_00121048;
      }
    }
  }
  Next(this);
  bVar4 = CheckedError::Check((CheckedError *)this);
  if (!bVar4) {
    CheckedError::~CheckedError((CheckedError *)this);
    anon_unknown_0::NoError();
  }
LAB_00121048:
  return SUB82(this,0);
}

Assistant:

CheckedError Parser::TryTypedValue(const std::string *name, int dtoken,
                                   bool check, Value &e, BaseType req,
                                   bool *destmatch) {
  FLATBUFFERS_ASSERT(*destmatch == false && dtoken == token_);
  *destmatch = true;
  e.constant = attribute_;
  // Check token match
  if (!check) {
    if (e.type.base_type == BASE_TYPE_NONE) {
      e.type.base_type = req;
    } else {
      return Error(std::string("type mismatch: expecting: ") +
                   TypeName(e.type.base_type) + ", found: " + TypeName(req) +
                   ", name: " + (name ? *name : "") + ", value: " + e.constant);
    }
  }
  // The exponent suffix of hexadecimal float-point number is mandatory.
  // A hex-integer constant is forbidden as an initializer of float number.
  if ((kTokenFloatConstant != dtoken) && IsFloat(e.type.base_type)) {
    const auto &s = e.constant;
    const auto k = s.find_first_of("0123456789.");
    if ((std::string::npos != k) && (s.length() > (k + 1)) &&
        (s[k] == '0' && is_alpha_char(s[k + 1], 'X')) &&
        (std::string::npos == s.find_first_of("pP", k + 2))) {
      return Error(
          "invalid number, the exponent suffix of hexadecimal "
          "floating-point literals is mandatory: \"" +
          s + "\"");
    }
  }
  NEXT();
  return NoError();
}